

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::MMapFile(string *filepath,MMapFileHandle *handle,bool writable,string *err)

{
  int iVar1;
  int __fd;
  char *__filename;
  FILE *__stream;
  size_t __len;
  uint8_t *puVar2;
  char *__modes;
  void *addr;
  int flags;
  int fd;
  size_t size;
  int ret;
  FILE *fp;
  string *err_local;
  bool writable_local;
  MMapFileHandle *handle_local;
  string *filepath_local;
  
  __filename = (char *)::std::__cxx11::string::c_str();
  __modes = "r";
  if (writable) {
    __modes = "rw";
  }
  __stream = fopen(__filename,__modes);
  if (__stream == (FILE *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"fopen failed.");
    }
    filepath_local._7_1_ = false;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      __len = ftell(__stream);
      fseek(__stream,0,0);
      if (__len == 0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=((string *)err,"File size is zero.");
        }
        filepath_local._7_1_ = false;
      }
      else {
        __fd = fileno(__stream);
        iVar1 = 1;
        if (writable) {
          iVar1 = 3;
        }
        puVar2 = (uint8_t *)mmap((void *)0x0,__len,iVar1,2,__fd,0);
        if (puVar2 == (uint8_t *)0xffffffffffffffff) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::operator+=((string *)err,"mmap failed.");
          }
          filepath_local._7_1_ = false;
        }
        else {
          handle->addr = puVar2;
          handle->size = __len;
          handle->writable = writable;
          ::std::__cxx11::string::operator=((string *)handle,(string *)filepath);
          close(__fd);
          filepath_local._7_1_ = true;
        }
      }
    }
    else {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Failed to fseek.");
      }
      fclose(__stream);
      filepath_local._7_1_ = false;
    }
  }
  return filepath_local._7_1_;
}

Assistant:

bool MMapFile(const std::string &filepath, MMapFileHandle *handle, bool writable, std::string *err) {

#if TINYUSDZ_MMAP_SUPPORTED
#if defined(_WIN32)
  //int fd = open(filepath.c_str(), writable ? O_RDWR : O_RDONLY);

  std::wstring unicode_filepath = UTF8ToWchar(filepath);
  HANDLE hFile = CreateFileW(unicode_filepath.c_str(), GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, nullptr);
  if (hFile == INVALID_HANDLE_VALUE) {
    if (err) {
      (*err) += "Failed to open file.";
    }
    return false;
  }

  if (!MMapFileImplWin32(hFile, handle, writable, err)) {
    return false;
  }

  handle->filename = filepath;
  handle->unicode_filename = unicode_filepath;

  return true;

#else   // !WIN32
  // assume posix
  FILE *fp = fopen(filepath.c_str(), writable ? "rw" : "r");
  if (!fp) {
    if (err) {
      (*err) += "fopen failed.";
    }
    return false;
  }

  int ret = std::fseek(fp, 0, SEEK_END);
  if (ret != 0) {
    if (err) {
      (*err) += "Failed to fseek.";
    }
    fclose(fp);
    return false;
  }

  size_t size = size_t(std::ftell(fp));
  std::fseek(fp, 0, SEEK_SET);

  if (size == 0) {
    if (err) {
      (*err) += "File size is zero.";
    }
    return false;
  }

  int fd = fileno(fp);

  int flags = MAP_PRIVATE;  // delayed access
  void *addr =
      mmap(nullptr, size, writable ? PROT_READ | PROT_WRITE : PROT_READ, flags,
           fd, 0);
  if (addr == MAP_FAILED) {
    if (err) {
      (*err) += "mmap failed.";
    }
    return false;
  }

  handle->addr = reinterpret_cast<uint8_t *>(addr);
  handle->size = uint64_t(size);
  handle->writable = writable;
  handle->filename = filepath;
  close(fd);

  return true;
#endif  // !WIN32
#else   // !TINYUSDZ_MMAP_SUPPORTED
  (void)filepath;
  (void)handle;
  (void)writable;
  (void)err;
  return false;
#endif
}